

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O1

ON_SubDDisplayParameters *
ON_SubDDisplayParameters::CreateFromMeshDensity
          (ON_SubDDisplayParameters *__return_storage_ptr__,double normalized_mesh_density)

{
  double dVar1;
  unsigned_short uVar2;
  bool bVar3;
  Context CVar4;
  bool bVar5;
  uchar uVar6;
  undefined8 uVar7;
  uint uVar8;
  ON__UINT_PTR OVar9;
  ON_Terminator *pOVar10;
  ON_ProgressReporter *pOVar11;
  double dVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  uchar uVar15;
  
  dVar1 = ON_MeshParameters::ClampMeshDensityValue(normalized_mesh_density);
  if ((dVar1 < 0.0) || (1.0 < dVar1)) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_subd_fragment.cpp"
               ,0xf7f,"","Invalid normalized_mesh_density parameter.");
    dVar12 = Default.m_progress_reporter_interval.m_t[1];
    pOVar11 = Default.m_progress_reporter;
    pOVar10 = Default.m_terminator;
    dVar1 = Default.m_reserved7;
    OVar9 = Default.m_reserved6;
    uVar7 = Default._8_8_;
    uVar14 = Default._0_8_;
    (__return_storage_ptr__->m_progress_reporter_interval).m_t[0] =
         Default.m_progress_reporter_interval.m_t[0];
    (__return_storage_ptr__->m_progress_reporter_interval).m_t[1] = dVar12;
    __return_storage_ptr__->m_terminator = pOVar10;
    __return_storage_ptr__->m_progress_reporter = pOVar11;
    __return_storage_ptr__->m_reserved6 = OVar9;
    __return_storage_ptr__->m_reserved7 = dVar1;
    uVar13 = Default._0_8_;
    Default.m_bDisplayDensityIsAbsolute = SUB81(uVar14,0);
    Default.m_display_density = SUB81(uVar14,1);
    uVar15 = Default.m_display_density;
    Default.m_reserved = SUB82(uVar14,2);
    uVar2 = Default.m_reserved;
    Default.m_bControlNetMesh = SUB81(uVar14,4);
    bVar3 = Default.m_bControlNetMesh;
    Default.m_context = SUB81(uVar14,5);
    CVar4 = Default.m_context;
    Default.m_bComputeCurvature = SUB81(uVar14,6);
    bVar5 = Default.m_bComputeCurvature;
    Default.m_reserved3 = SUB81(uVar14,7);
    uVar6 = Default.m_reserved3;
    __return_storage_ptr__->m_bDisplayDensityIsAbsolute = Default.m_bDisplayDensityIsAbsolute;
    Default._0_8_ = uVar13;
    uVar14 = Default._8_8_;
    __return_storage_ptr__->m_display_density = uVar15;
    __return_storage_ptr__->m_reserved = uVar2;
    __return_storage_ptr__->m_bControlNetMesh = bVar3;
    __return_storage_ptr__->m_context = CVar4;
    __return_storage_ptr__->m_bComputeCurvature = bVar5;
    __return_storage_ptr__->m_reserved3 = uVar6;
    Default.m_reserved4 = (uint)uVar7;
    Default.m_reserved5 = SUB84(uVar7,4);
    uVar8 = Default.m_reserved5;
    __return_storage_ptr__->m_reserved4 = Default.m_reserved4;
    Default._8_8_ = uVar14;
    __return_storage_ptr__->m_reserved5 = uVar8;
  }
  else {
    uVar15 = '\x01';
    if ((((2.3283064365386963e-10 < dVar1) && (uVar15 = '\x02', 0.2 <= dVar1)) &&
        (uVar15 = '\x03', 0.35 <= dVar1)) &&
       (((uVar15 = '\x04', 0.75 < dVar1 && (uVar15 = '\x05', 0.9999999997671694 <= dVar1)) &&
        (1.0000000002328306 < dVar1)))) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_subd_fragment.cpp"
                 ,0xf78,"","Bug in some if condition in this function.");
      uVar15 = '\x04';
    }
    __return_storage_ptr__->m_terminator = (ON_Terminator *)0x0;
    __return_storage_ptr__->m_progress_reporter = (ON_ProgressReporter *)0x0;
    __return_storage_ptr__->m_reserved6 = 0;
    __return_storage_ptr__->m_reserved7 = 0.0;
    __return_storage_ptr__->m_bDisplayDensityIsAbsolute = false;
    __return_storage_ptr__->m_display_density = '\0';
    __return_storage_ptr__->m_reserved = 0;
    __return_storage_ptr__->m_bControlNetMesh = false;
    __return_storage_ptr__->m_context = Unknown;
    __return_storage_ptr__->m_bComputeCurvature = false;
    __return_storage_ptr__->m_reserved3 = '\0';
    __return_storage_ptr__->m_reserved4 = 0;
    dVar1 = ON_Interval::ZeroToOne.m_t[1];
    __return_storage_ptr__->m_reserved5 = 0;
    (__return_storage_ptr__->m_progress_reporter_interval).m_t[0] = ON_Interval::ZeroToOne.m_t[0];
    (__return_storage_ptr__->m_progress_reporter_interval).m_t[1] = dVar1;
    __return_storage_ptr__->m_display_density = uVar15;
    __return_storage_ptr__->m_bDisplayDensityIsAbsolute = false;
  }
  return __return_storage_ptr__;
}

Assistant:

const ON_SubDDisplayParameters ON_SubDDisplayParameters::CreateFromMeshDensity(
  double normalized_mesh_density
)
{
  normalized_mesh_density = ON_MeshParameters::ClampMeshDensityValue(normalized_mesh_density);

  if (normalized_mesh_density >= 0.0 && normalized_mesh_density <= 1.0)
  {
    unsigned int subd_display_density;

    if (normalized_mesh_density <= ON_ZERO_TOLERANCE)
      subd_display_density = ON_SubDDisplayParameters::ExtraCoarseDensity;
    else if (normalized_mesh_density < 0.20)
      subd_display_density = ON_SubDDisplayParameters::CoarseDensity;
    else if (normalized_mesh_density < 0.35)
      subd_display_density = ON_SubDDisplayParameters::MediumDensity;
    else if (normalized_mesh_density <= 0.75)
      subd_display_density = ON_SubDDisplayParameters::FineDensity;
    else if (normalized_mesh_density < 1.0 - ON_ZERO_TOLERANCE)
      subd_display_density = ON_SubDDisplayParameters::ExtraFineDensity;
    else if (normalized_mesh_density <= 1.0 + ON_ZERO_TOLERANCE)
      subd_display_density = ON_SubDDisplayParameters::ExtraFineDensity;
    else
    {
      ON_ERROR("Bug in some if condition in this function.");
      subd_display_density = ON_SubDDisplayParameters::DefaultDensity;
    }

    return ON_SubDDisplayParameters::CreateFromDisplayDensity(subd_display_density);
  }

  ON_ERROR("Invalid normalized_mesh_density parameter.");
  return ON_SubDDisplayParameters::Default;
}